

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleline.h
# Opt level: O1

void __thiscall bandit::reporter::singleline::print_status_line(singleline *this)

{
  ostream *poVar1;
  long *local_58;
  long local_50;
  long local_48 [2];
  char local_38;
  undefined7 uStack_37;
  long local_30;
  long local_28 [2];
  
  local_38 = '\r';
  std::__ostream_insert<char,std::char_traits<char>>((this->super_colored_base).stm_,&local_38,1);
  poVar1 = (this->super_colored_base).stm_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Executed ",9);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,(this->super_colored_base).super_progress_base.specs_run_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," tests.",7);
  if ((this->super_colored_base).super_progress_base.specs_failed_ != 0) {
    poVar1 = (this->super_colored_base).stm_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,
                        (this->super_colored_base).super_progress_base.specs_succeeded_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," succeeded. ",0xc);
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_38);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(char *)CONCAT71(uStack_37,local_38),local_30);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,
                        (this->super_colored_base).super_progress_base.specs_failed_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," failed.",8);
    (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_58,local_50);
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if ((long *)CONCAT71(uStack_37,local_38) != local_28) {
      operator_delete((long *)CONCAT71(uStack_37,local_38),local_28[0] + 1);
    }
  }
  std::ostream::flush();
  return;
}

Assistant:

void print_status_line() {
        stm_ << '\r';
        stm_ << "Executed " << specs_run_ << " tests.";

        if (specs_failed_) {
          stm_
              << " " << specs_succeeded_ << " succeeded. "
              << colorizer_.bad() << specs_failed_ << " failed."
              << colorizer_.reset();
        }
        stm_.flush();
      }